

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

string * asciidump<unsigned_char_const*>(string *__return_storage_ptr__,uchar *buf,size_t bytelen)

{
  byte bVar1;
  uint8_t c;
  undefined8 local_20;
  size_t bytelen_local;
  uchar *buf_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_20 = bytelen;
  bytelen_local = (size_t)buf;
  while (local_20 != 0) {
    bVar1 = *(byte *)bytelen_local;
    if ((bVar1 < 0x20) || (0x7e < bVar1)) {
      bVar1 = 0x2e;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar1);
    local_20 = local_20 - 1;
    bytelen_local = bytelen_local + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string asciidump(P buf, size_t bytelen)
{
    std::string str;
    str.reserve(bytelen);
    while(bytelen--)
    {
        uint8_t c= *buf++;
        str += (c>=' ' && c<='~')?c:'.';
    }

    return str;
}